

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lzh_copy_from_window(lzh_stream *strm,lzh_dec *ds)

{
  int64_t *piVar1;
  size_t sVar2;
  size_t __n;
  
  sVar2 = (size_t)ds->w_remaining;
  if ((sVar2 == 0) && (0 < (long)ds->w_pos)) {
    __n = (long)ds->w_pos - (long)ds->copy_pos;
    if (strm->avail_out < (long)__n) {
      __n = strm->avail_out;
    }
    memcpy(strm->next_out,ds->w_buff + ds->copy_pos,__n);
    ds->copy_pos = ds->copy_pos + (int)__n;
  }
  else {
    __n = strm->avail_out;
    if ((long)sVar2 <= strm->avail_out) {
      __n = sVar2;
    }
    memcpy(strm->next_out,ds->w_buff + ((long)ds->w_size - sVar2),__n);
    ds->w_remaining = ds->w_remaining - (int)__n;
  }
  strm->next_out = strm->next_out + __n;
  strm->total_out = strm->total_out + __n;
  piVar1 = &strm->avail_out;
  *piVar1 = *piVar1 - __n;
  return (wchar_t)(*piVar1 != 0);
}

Assistant:

static int
lzh_copy_from_window(struct lzh_stream *strm, struct lzh_dec *ds)
{
	size_t copy_bytes;

	if (ds->w_remaining == 0 && ds->w_pos > 0) {
		if (ds->w_pos - ds->copy_pos <= strm->avail_out)
			copy_bytes = ds->w_pos - ds->copy_pos;
		else
			copy_bytes = (size_t)strm->avail_out;
		memcpy(strm->next_out,
		    ds->w_buff + ds->copy_pos, copy_bytes);
		ds->copy_pos += (int)copy_bytes;
	} else {
		if (ds->w_remaining <= strm->avail_out)
			copy_bytes = ds->w_remaining;
		else
			copy_bytes = (size_t)strm->avail_out;
		memcpy(strm->next_out,
		    ds->w_buff + ds->w_size - ds->w_remaining, copy_bytes);
		ds->w_remaining -= (int)copy_bytes;
	}
	strm->next_out += copy_bytes;
	strm->avail_out -= copy_bytes;
	strm->total_out += copy_bytes;
	if (strm->avail_out == 0)
		return (0);
	else
		return (1);
}